

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O1

bool google::protobuf::json_internal::operator==(MaybeOwnedString *lhs,char (*rhs) [10])

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  string_view sVar4;
  
  sVar4 = MaybeOwnedString::AsView(lhs);
  __n = sVar4._M_len;
  sVar2 = strlen(*rhs);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(sVar4._M_str,rhs,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const MaybeOwnedString& lhs, const String& rhs) {
    return lhs.AsView() == rhs;
  }